

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

uint strhashl(char *s,int l)

{
  uint uVar1;
  int local_20;
  int i;
  uint g;
  uint h;
  int l_local;
  char *s_local;
  
  i = 0;
  _h = s;
  for (local_20 = 0; local_20 < l; local_20 = local_20 + 1) {
    i = i * 0x10 + (int)*_h;
    uVar1 = i & 0xf0000000;
    if (uVar1 != 0) {
      i = i ^ uVar1 >> 0x18 ^ uVar1;
    }
    _h = _h + 1;
  }
  return i;
}

Assistant:

uint strhashl(const char *s, int l) {
  uint h = 0, g;
  int i = 0;

  for (; i < l; i++, s++) {
    h = (h << 4) + *s;
    if ((g = h & 0xf0000000)) h = (h ^ (g >> 24)) ^ g;
  }
  return h;
}